

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O1

bool cmSystemTools::RemoveRPath(string *file,string *emsg,bool *removed)

{
  uint index;
  StringEntry *__tmp;
  StringEntry *pSVar1;
  ulong uVar2;
  unsigned_long uVar3;
  ulong uVar4;
  long *plVar5;
  char *pcVar6;
  pointer buf;
  undefined8 unaff_R12;
  int i;
  uint uVar7;
  ulong uVar8;
  bool bVar9;
  StringEntry *se [2];
  vector<char,_std::allocator<char>_> bytes;
  unsigned_long entryBegin [3];
  unsigned_long entryEnd [2];
  unsigned_long zeroSize [2];
  unsigned_long zeroPosition [2];
  ofstream f;
  value_type local_2e9;
  bool *local_2e8;
  string *local_2e0;
  StringEntry *local_2d8 [3];
  ulong local_2c0;
  vector<char,_std::allocator<char>_> local_2b8;
  unsigned_long local_298 [4];
  ulong local_278;
  string *local_270;
  unsigned_long local_268 [7];
  undefined1 local_230 [32];
  byte abStack_210 [216];
  ios_base local_138 [264];
  
  if (removed != (bool *)0x0) {
    *removed = false;
  }
  local_268[4] = 0;
  local_268[5] = 0;
  local_268[2] = 0;
  local_268[3] = 0;
  local_2b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
       = (char *)0x0;
  local_2b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_2b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  cmELF::cmELF((cmELF *)local_230,(file->_M_dataplus)._M_p);
  local_2d8[0] = (StringEntry *)0x0;
  local_2d8[1] = (StringEntry *)0x0;
  pSVar1 = cmELF::GetRPath((cmELF *)local_230);
  bVar9 = pSVar1 != (StringEntry *)0x0;
  if (bVar9) {
    local_2d8[0] = pSVar1;
  }
  pSVar1 = cmELF::GetRunPath((cmELF *)local_230);
  uVar8 = (ulong)bVar9;
  if (pSVar1 != (StringEntry *)0x0) {
    uVar8 = (ulong)(bVar9 + 1);
    local_2d8[bVar9] = pSVar1;
  }
  pSVar1 = local_2d8[0];
  uVar7 = (uint)uVar8;
  uVar2 = CONCAT71((int7)((ulong)unaff_R12 >> 8),uVar7 == 0);
  local_2e0 = emsg;
  local_270 = file;
  if (uVar7 == 0) {
LAB_00135e7d:
    bVar9 = false;
    uVar8 = 0;
    uVar7 = 0;
  }
  else {
    if ((uVar7 == 2) && (local_2d8[1]->IndexInSection < local_2d8[0]->IndexInSection)) {
      local_2d8[0] = local_2d8[1];
      local_2d8[1] = pSVar1;
    }
    index = cmELF::GetDynamicEntryCount((cmELF *)local_230);
    if (index == 0) {
      if (emsg == (string *)0x0) goto LAB_00135e7d;
      bVar9 = false;
      std::__cxx11::string::_M_replace((ulong)emsg,0,(char *)emsg->_M_string_length,0x1d4d65);
      uVar8 = 0;
      uVar7 = 0;
    }
    else {
      local_2c0 = uVar2;
      if (uVar7 != 0) {
        uVar2 = 0;
        do {
          pSVar1 = local_2d8[uVar2];
          local_268[uVar2 + 4] = pSVar1->Position;
          local_268[uVar2 + 2] = pSVar1->Size;
          uVar2 = uVar2 + 1;
        } while (uVar8 != uVar2);
      }
      local_298[0] = 0;
      local_298[1] = 0;
      local_298[2] = 0;
      local_268[0] = 0;
      local_268[1] = 0;
      local_2e8 = removed;
      if (uVar7 != 0) {
        uVar2 = 0;
        do {
          pSVar1 = local_2d8[uVar2];
          uVar3 = cmELF::GetDynamicEntryPosition((cmELF *)local_230,pSVar1->IndexInSection);
          local_298[uVar2] = uVar3;
          uVar3 = cmELF::GetDynamicEntryPosition((cmELF *)local_230,pSVar1->IndexInSection + 1);
          local_268[uVar2] = uVar3;
          uVar2 = uVar2 + 1;
        } while (uVar8 != uVar2);
      }
      uVar3 = cmELF::GetDynamicEntryPosition((cmELF *)local_230,index);
      local_298[uVar8] = uVar3;
      local_278 = local_298[0];
      local_2e9 = '\0';
      std::vector<char,_std::allocator<char>_>::resize(&local_2b8,uVar3 - local_298[0],&local_2e9);
      uVar2 = 0;
      buf = local_2b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_start;
      do {
        uVar4 = uVar2;
        if (uVar8 == uVar4) break;
        uVar3 = local_298[uVar4 + 1] - local_268[uVar4];
        if ((uVar3 == 0) ||
           (bVar9 = cmELF::ReadBytes((cmELF *)local_230,local_268[uVar4],uVar3,buf), bVar9)) {
          buf = buf + uVar3;
          bVar9 = true;
        }
        else if (local_2e0 == (string *)0x0) {
          bVar9 = false;
        }
        else {
          bVar9 = false;
          std::__cxx11::string::_M_replace
                    ((ulong)local_2e0,0,(char *)local_2e0->_M_string_length,0x1d4d98);
        }
        uVar2 = uVar4 + 1;
      } while (bVar9);
      bVar9 = uVar8 <= uVar4;
      uVar8 = local_278;
      uVar2 = local_2c0;
      emsg = local_2e0;
      removed = local_2e8;
    }
  }
  cmELF::~cmELF((cmELF *)local_230);
  if (!bVar9) goto LAB_00135fa4;
  std::ofstream::ofstream(local_230,(local_270->_M_dataplus)._M_p,_S_out|_S_in|_S_bin);
  if ((abStack_210
       [(long)(((cmELFInternal *)(local_230._0_8_ + -0x58))->DynamicSectionStrings)._M_t._M_impl.
              super__Rb_tree_header._M_header._M_left] & 5) == 0) {
    plVar5 = (long *)std::ostream::seekp(local_230,uVar8,0);
    if ((*(byte *)((long)plVar5 + *(long *)(*plVar5 + -0x18) + 0x20) & 5) == 0) {
      plVar5 = (long *)std::ostream::write(local_230,
                                           (long)local_2b8.
                                                 super__Vector_base<char,_std::allocator<char>_>.
                                                 _M_impl.super__Vector_impl_data._M_start);
      if ((*(byte *)((long)plVar5 + *(long *)(*plVar5 + -0x18) + 0x20) & 5) == 0) {
        bVar9 = uVar7 != 0;
        if (uVar7 != 0) {
          local_2c0 = uVar2;
          uVar8 = 0;
          local_2e8 = removed;
          do {
            plVar5 = (long *)std::ostream::seekp((ostream *)local_230,local_268[uVar8 + 4],0);
            removed = local_2e8;
            if ((*(byte *)((long)plVar5 + *(long *)(*plVar5 + -0x18) + 0x20) & 5) != 0) {
              if (emsg == (string *)0x0) {
                uVar2 = 0;
              }
              else {
                pcVar6 = "Error seeking to RPATH position.";
LAB_001360a1:
                removed = local_2e8;
                std::__cxx11::string::operator=((string *)emsg,pcVar6);
LAB_001360a9:
                uVar2 = 0;
              }
              break;
            }
            emsg = local_2e0;
            uVar2 = local_2c0;
            for (uVar3 = local_268[uVar8 + 2]; local_2e8 = removed, local_2e0 = emsg,
                local_2c0 = uVar2, uVar3 != 0; uVar3 = uVar3 - 1) {
              local_298[0] = local_298[0] & 0xffffffffffffff00;
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_230,(char *)local_298,1);
              removed = local_2e8;
              emsg = local_2e0;
              uVar2 = local_2c0;
            }
            if ((abStack_210
                 [(long)(((cmELFInternal *)(local_230._0_8_ + -0x58))->DynamicSectionStrings)._M_t.
                        _M_impl.super__Rb_tree_header._M_header._M_left] & 5) != 0) {
              if (emsg != (string *)0x0) {
                pcVar6 = "Error writing the empty rpath string to the file.";
                goto LAB_001360a1;
              }
              goto LAB_001360a9;
            }
            uVar8 = uVar8 + 1;
            bVar9 = uVar8 < uVar7;
          } while (uVar8 != uVar7);
        }
        uVar2 = (ulong)(byte)(bVar9 ^ 1U | (byte)uVar2);
        if ((removed != (bool *)0x0) && (bVar9 == false)) {
          *removed = true;
          uVar2 = 1;
        }
        goto LAB_00135f6c;
      }
      if (emsg == (string *)0x0) goto LAB_00135f69;
      pcVar6 = "Error replacing DYNAMIC table header.";
    }
    else {
      if (emsg == (string *)0x0) goto LAB_00135f69;
      pcVar6 = "Error seeking to DYNAMIC table header for RPATH.";
    }
LAB_00135f56:
    uVar2 = 0;
    std::__cxx11::string::_M_replace((ulong)emsg,0,(char *)emsg->_M_string_length,(ulong)pcVar6);
  }
  else {
    if (emsg != (string *)0x0) {
      pcVar6 = "Error opening file for update.";
      goto LAB_00135f56;
    }
LAB_00135f69:
    uVar2 = 0;
  }
LAB_00135f6c:
  local_230._0_8_ = _VTT;
  *(undefined8 *)
   (local_230 +
   (long)_VTT[-1].DynamicSectionStrings._M_t._M_impl.super__Rb_tree_header._M_header._M_left) =
       ___throw_bad_array_new_length;
  std::filebuf::~filebuf((filebuf *)(local_230 + 8));
  std::ios_base::~ios_base(local_138);
LAB_00135fa4:
  if (local_2b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (char *)0x0) {
    operator_delete(local_2b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_2b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_2b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return (bool)((byte)uVar2 & 1);
}

Assistant:

bool cmSystemTools::RemoveRPath(std::string const& file, std::string* emsg,
                                bool* removed)
{
#if defined(CMAKE_USE_ELF_PARSER)
  if(removed)
    {
    *removed = false;
    }
  int zeroCount = 0;
  unsigned long zeroPosition[2] = {0,0};
  unsigned long zeroSize[2] = {0,0};
  unsigned long bytesBegin = 0;
  std::vector<char> bytes;
  {
  // Parse the ELF binary.
  cmELF elf(file.c_str());

  // Get the RPATH and RUNPATH entries from it and sort them by index
  // in the dynamic section header.
  int se_count = 0;
  cmELF::StringEntry const* se[2] = {0, 0};
  if(cmELF::StringEntry const* se_rpath = elf.GetRPath())
    {
    se[se_count++] = se_rpath;
    }
  if(cmELF::StringEntry const* se_runpath = elf.GetRunPath())
    {
    se[se_count++] = se_runpath;
    }
  if(se_count == 0)
    {
    // There is no RPATH or RUNPATH anyway.
    return true;
    }
  if(se_count == 2 && se[1]->IndexInSection < se[0]->IndexInSection)
    {
    std::swap(se[0], se[1]);
    }

  // Get the size of the dynamic section header.
  unsigned int count = elf.GetDynamicEntryCount();
  if(count == 0)
    {
    // This should happen only for invalid ELF files where a DT_NULL
    // appears before the end of the table.
    if(emsg)
      {
      *emsg = "DYNAMIC section contains a DT_NULL before the end.";
      }
    return false;
    }

  // Save information about the string entries to be zeroed.
  zeroCount = se_count;
  for(int i=0; i < se_count; ++i)
    {
    zeroPosition[i] = se[i]->Position;
    zeroSize[i] = se[i]->Size;
    }

  // Get the range of file positions corresponding to each entry and
  // the rest of the table after them.
  unsigned long entryBegin[3] = {0,0,0};
  unsigned long entryEnd[2] = {0,0};
  for(int i=0; i < se_count; ++i)
    {
    entryBegin[i] = elf.GetDynamicEntryPosition(se[i]->IndexInSection);
    entryEnd[i] = elf.GetDynamicEntryPosition(se[i]->IndexInSection+1);
    }
  entryBegin[se_count] = elf.GetDynamicEntryPosition(count);

  // The data are to be written over the old table entries starting at
  // the first one being removed.
  bytesBegin = entryBegin[0];
  unsigned long bytesEnd = entryBegin[se_count];

  // Allocate a buffer to hold the part of the file to be written.
  // Initialize it with zeros.
  bytes.resize(bytesEnd - bytesBegin, 0);

  // Read the part of the DYNAMIC section header that will move.
  // The remainder of the buffer will be left with zeros which
  // represent a DT_NULL entry.
  char* data = &bytes[0];
  for(int i=0; i < se_count; ++i)
    {
    // Read data between the entries being removed.
    unsigned long sz = entryBegin[i+1] - entryEnd[i];
    if(sz > 0 && !elf.ReadBytes(entryEnd[i], sz, data))
      {
      if(emsg)
        {
        *emsg = "Failed to read DYNAMIC section header.";
        }
      return false;
      }
    data += sz;
    }
  }

  // Open the file for update.
  cmsys::ofstream f(file.c_str(),
                  std::ios::in | std::ios::out | std::ios::binary);
  if(!f)
    {
    if(emsg)
      {
      *emsg = "Error opening file for update.";
      }
    return false;
    }

  // Write the new DYNAMIC table header.
  if(!f.seekp(bytesBegin))
    {
    if(emsg)
      {
      *emsg = "Error seeking to DYNAMIC table header for RPATH.";
      }
    return false;
    }
  if(!f.write(&bytes[0], bytes.size()))
    {
    if(emsg)
      {
      *emsg = "Error replacing DYNAMIC table header.";
      }
    return false;
    }

  // Fill the RPATH and RUNPATH strings with zero bytes.
  for(int i=0; i < zeroCount; ++i)
    {
    if(!f.seekp(zeroPosition[i]))
      {
      if(emsg)
        {
        *emsg = "Error seeking to RPATH position.";
        }
      return false;
      }
    for(unsigned long j=0; j < zeroSize[i]; ++j)
      {
      f << '\0';
      }
    if(!f)
      {
      if(emsg)
        {
        *emsg = "Error writing the empty rpath string to the file.";
        }
      return false;
      }
    }

  // Everything was updated successfully.
  if(removed)
    {
    *removed = true;
    }
  return true;
#else
  (void)file;
  (void)emsg;
  (void)removed;
  return false;
#endif
}